

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Scene::changeState(Scene *this)

{
  int iVar1;
  
  if ((this->state & 0xfffffffeU) != 4) {
    iVar1 = (int)(this->state + 1U) % 3;
    this->state = iVar1;
    this->ss->state = iVar1;
    this->gs->state = iVar1;
  }
  return;
}

Assistant:

void Scene::changeState(){
	if(state == STATE_OVER || state == STATE_PAUSE){
		return;
	}
	state = (state+1)%STATE_NUMBER;
	ss->setState(state);
	gs->setState(state);
}